

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O2

void __thiscall Privkey_Privkey_ByteData256_Test::TestBody(Privkey_Privkey_ByteData256_Test *this)

{
  char *message;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_88;
  AssertionResult gtest_ar;
  string local_60;
  Privkey privkey;
  ByteData256 bytedata;
  
  std::__cxx11::string::string
            ((string *)&privkey,"305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27",
             (allocator *)&local_60);
  cfd::core::ByteData256::ByteData256(&bytedata,(string *)&privkey);
  std::__cxx11::string::~string((string *)&privkey);
  cfd::core::Privkey::Privkey(&privkey,&bytedata,kMainnet,true);
  cfd::core::Privkey::GetData((ByteData *)&_Stack_88,&privkey);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_60,(ByteData *)&_Stack_88);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"privkey.GetData().GetHex().c_str()",
             "\"305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27\"",
             local_60._M_dataplus._M_p,
             "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
  std::__cxx11::string::~string((string *)&local_60);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_88);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&_Stack_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_privkey.cpp"
               ,0x28,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&_Stack_88,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&_Stack_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_60);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&privkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&bytedata);
  return;
}

Assistant:

TEST(Privkey, Privkey_ByteData256) {
  ByteData256 bytedata(
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
  Privkey privkey(bytedata);
  EXPECT_STREQ(
      privkey.GetData().GetHex().c_str(),
      "305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
}